

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_ARB1_sampler(Context *ctx,int stage,TextureType ttype,int tb)

{
  int iVar1;
  size_t in_R8;
  int iVar2;
  char var [64];
  
  if (tb != 0) {
    iVar1 = ctx->uniform_bool_count;
    iVar2 = ctx->uniform_int4_count + ctx->uniform_float4_count;
    get_D3D_varname_in_buf(ctx,REG_TYPE_SAMPLER,stage,var,in_R8);
    push_output(ctx,&ctx->globals);
    output_line(ctx,"PARAM %s_texbem = program.local[%d];",var,(ulong)(uint)(iVar2 + iVar1));
    output_line(ctx,"PARAM %s_texbeml = program.local[%d];",var,(ulong)(iVar1 + iVar2 + 1));
    pop_output(ctx);
    ctx->uniform_float4_count = ctx->uniform_float4_count + 2;
  }
  return;
}

Assistant:

static void emit_ARB1_sampler(Context *ctx,int stage,TextureType ttype,int tb)
{
    // this is mostly a no-op...you don't predeclare samplers in arb1.

    if (tb)  // This sampler used a ps_1_1 TEXBEM opcode?
    {
        const int index = ctx->uniform_float4_count + ctx->uniform_int4_count +
                          ctx->uniform_bool_count;
        char var[64];
        get_ARB1_varname_in_buf(ctx, REG_TYPE_SAMPLER, stage, var, sizeof(var));
        push_output(ctx, &ctx->globals);
        output_line(ctx, "PARAM %s_texbem = program.local[%d];", var, index);
        output_line(ctx, "PARAM %s_texbeml = program.local[%d];", var, index+1);
        pop_output(ctx);
        ctx->uniform_float4_count += 2;
    } // if
}